

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastEr0P1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  anon_class_40_5_0fd15717 add;
  anon_class_24_3_a3086cf8 size_callback;
  uint *puVar2;
  RepeatedField<int> *pRVar3;
  char *pcVar4;
  undefined7 uStack_6f;
  undefined7 uStack_57;
  
  if (data.field_0._0_1_ == '\0') {
    if ((ulong)table->has_bits_offset != 0) {
      puVar2 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar2 = *puVar2 | (uint)hasbits;
    }
    cVar1 = *ptr;
    pRVar3 = RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
    add._1_7_ = uStack_6f;
    add.max = data.field_0._3_1_;
    add._25_7_ = uStack_57;
    add.saved_tag = cVar1;
    add.msg = msg;
    add.table = table;
    add.field = pRVar3;
    size_callback.ctx = ctx;
    size_callback.field = pRVar3;
    size_callback.ptr = ptr + 1;
    pcVar4 = EpsCopyInputStream::
             ReadPackedVarint<google::protobuf::internal::TcParser::PackedEnumSmallRange<unsigned_char,(unsigned_char)0>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_,google::protobuf::internal::TcParser::PackedEnumSmallRange<unsigned_char,(unsigned_char)0>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_2_>
                       (&ctx->super_EpsCopyInputStream,ptr + 1,add,size_callback);
    return pcVar4;
  }
  pcVar4 = MiniParse(msg,ptr,ctx,data,table,hasbits);
  return pcVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr0P1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return PackedEnumSmallRange<uint8_t, 0>(
      PROTOBUF_TC_PARAM_PASS);
}